

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::resize(QWidget *this,QSize *s)

{
  long lVar1;
  bool bVar2;
  QWidgetPrivate *this_00;
  QSize QVar3;
  QRect *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  QRect oldRect;
  int in_stack_000000f8;
  int in_stack_000000fc;
  QRect *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  WidgetAttribute attribute;
  QWidget *in_stack_ffffffffffffff88;
  QSize *this_01;
  QWidget *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffd0;
  undefined1 isMove;
  undefined8 in_stack_ffffffffffffffd8;
  QWidgetPrivate *in_stack_ffffffffffffffe0;
  QWidget *in_stack_ffffffffffffffe8;
  QWidget *this_02;
  
  isMove = (undefined1)((ulong)in_stack_ffffffffffffffd0 >> 0x38);
  attribute = (WidgetAttribute)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWidget *)0x375ca5);
  setAttribute(in_stack_ffffffffffffffe8,(WidgetAttribute)((ulong)in_stack_ffffffffffffffe0 >> 0x20)
               ,SUB81((ulong)in_stack_ffffffffffffffe0 >> 0x18,0));
  bVar2 = testAttribute(in_stack_ffffffffffffff88,attribute);
  if (bVar2) {
    QWidgetPrivate::fixPosIncludesFrame
              ((QWidgetPrivate *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    geometry(in_RDI);
    QRect::x((QRect *)0x375cfc);
    geometry(in_RDI);
    QRect::y((QRect *)0x375d12);
    QSize::width((QSize *)0x375d20);
    QSize::height((QSize *)0x375d2e);
    QWidgetPrivate::setGeometry_sys
              (in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
               (int)in_stack_ffffffffffffffd8,in_stack_000000fc,in_stack_000000f8,(bool)isMove);
    QWidgetPrivate::setDirtyOpaqueRegion(this_00);
  }
  else {
    this_02 = *(QWidget **)&in_RDI->data->crect;
    this_01 = (QSize *)&in_RDI->data->crect;
    maximumSize(in_stack_ffffffffffffff90);
    QSize::boundedTo(this_01,(QSize *)in_RSI);
    minimumSize(in_stack_ffffffffffffff90);
    QVar3 = QSize::expandedTo(this_01,(QSize *)in_RSI);
    QRect::setSize((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (QSize *)in_stack_ffffffffffffff90);
    bVar2 = ::operator!=(in_RSI,in_stack_ffffffffffffff78);
    if (bVar2) {
      setAttribute(this_02,QVar3.ht.m_i.m_i,QVar3.wd.m_i._3_1_);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::resize(const QSize &s)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_Resized);
    if (testAttribute(Qt::WA_WState_Created)) {
        d->fixPosIncludesFrame();
        d->setGeometry_sys(geometry().x(), geometry().y(), s.width(), s.height(), false);
        d->setDirtyOpaqueRegion();
    } else {
        const auto oldRect = data->crect;
        data->crect.setSize(s.boundedTo(maximumSize()).expandedTo(minimumSize()));
        if (oldRect != data->crect)
            setAttribute(Qt::WA_PendingResizeEvent);
    }
}